

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::DeadCodeEliminationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,DeadCodeEliminationCase *this,bool optimized)

{
  undefined1 useHeavierWorkload;
  undefined7 in_register_00000011;
  bool useHeavierWorkload_00;
  bool bVar1;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string statements;
  undefined1 local_60 [8];
  string funcDefs;
  string precision;
  bool isVertexCase;
  bool optimized_local;
  DeadCodeEliminationCase *this_local;
  
  useHeavierWorkload_00 =
       (this->super_ShaderOptimizationCase).m_caseShaderType == CASESHADERTYPE_VERTEX;
  useHeavierWorkload = useHeavierWorkload_00;
  Performance::(anonymous_namespace)::getShaderPrecision_abi_cxx11_
            ((string *)((long)&funcDefs.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)(this->super_ShaderOptimizationCase).m_caseShaderType,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  statements.field_2._M_local_buf[10] = '\0';
  if (this->m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
    deadBranchFuncCallCaseFuncDefs
              ((string *)local_60,optimized,(string *)((long)&funcDefs.field_2 + 8));
  }
  else if (this->m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
    useHeavierWorkload = useHeavierWorkload_00;
    unusedValueAfterReturnCaseFuncDefs
              ((string *)local_60,optimized,(string *)((long)&funcDefs.field_2 + 8),
               useHeavierWorkload_00);
  }
  else {
    std::allocator<char>::allocator();
    statements.field_2._M_local_buf[10] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"",(allocator<char> *)(statements.field_2._M_local_buf + 0xb));
  }
  if ((statements.field_2._M_local_buf[10] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(statements.field_2._M_local_buf + 0xb));
  }
  bVar1 = false;
  if (this->m_caseType == CASETYPE_DEAD_BRANCH_SIMPLE) {
    Performance::(anonymous_namespace)::DeadCodeEliminationCase::
    deadBranchSimpleCaseStatements_abi_cxx11_
              ((string *)local_90,(DeadCodeEliminationCase *)(ulong)(optimized & 1),
               useHeavierWorkload_00,(bool)useHeavierWorkload);
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX) {
    deadBranchComplexCaseStatements
              ((string *)local_90,optimized,(string *)((long)&funcDefs.field_2 + 8),true,
               useHeavierWorkload_00);
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST) {
    deadBranchComplexCaseStatements
              ((string *)local_90,optimized,(string *)((long)&funcDefs.field_2 + 8),false,
               useHeavierWorkload_00);
  }
  else if (this->m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL) {
    Performance::(anonymous_namespace)::DeadCodeEliminationCase::
    deadBranchFuncCallCaseStatements_abi_cxx11_
              ((string *)local_90,(DeadCodeEliminationCase *)(ulong)(optimized & 1),
               useHeavierWorkload_00,(bool)useHeavierWorkload);
  }
  else if (this->m_caseType == CASETYPE_UNUSED_VALUE_BASIC) {
    unusedValueBasicCaseStatements
              ((string *)local_90,optimized,(string *)((long)&funcDefs.field_2 + 8),
               useHeavierWorkload_00);
  }
  else if (this->m_caseType == CASETYPE_UNUSED_VALUE_LOOP) {
    unusedValueLoopCaseStatements
              ((string *)local_90,optimized,(string *)((long)&funcDefs.field_2 + 8),
               useHeavierWorkload_00);
  }
  else if (this->m_caseType == CASETYPE_UNUSED_VALUE_DEAD_BRANCH) {
    unusedValueDeadBranchCaseStatements
              ((string *)local_90,optimized,(string *)((long)&funcDefs.field_2 + 8),
               useHeavierWorkload_00);
  }
  else if (this->m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN) {
    Performance::(anonymous_namespace)::DeadCodeEliminationCase::
    unusedValueAfterReturnCaseStatements_abi_cxx11_();
  }
  else {
    bVar1 = this->m_caseType != CASETYPE_UNUSED_VALUE_MUL_ZERO;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,(char *)0x0,&local_91);
    }
    else {
      unusedValueMulZeroCaseStatements
                ((string *)local_90,optimized,(string *)((long)&funcDefs.field_2 + 8),
                 useHeavierWorkload_00);
    }
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_91);
  }
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     (string *)local_60,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(funcDefs.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	funcDefs		= m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL		? deadBranchFuncCallCaseFuncDefs		(optimized, precision)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN	? unusedValueAfterReturnCaseFuncDefs	(optimized, precision, isVertexCase)
										: "";

		const string	statements		= m_caseType == CASETYPE_DEAD_BRANCH_SIMPLE				? deadBranchSimpleCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX			? deadBranchComplexCaseStatements			(optimized, precision, true,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? deadBranchComplexCaseStatements			(optimized, precision, false,	isVertexCase)
										: m_caseType == CASETYPE_DEAD_BRANCH_FUNC_CALL			? deadBranchFuncCallCaseStatements			(optimized, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_BASIC				? unusedValueBasicCaseStatements			(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_LOOP				? unusedValueLoopCaseStatements				(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? unusedValueDeadBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_UNUSED_VALUE_AFTER_RETURN		? unusedValueAfterReturnCaseStatements		()
										: m_caseType == CASETYPE_UNUSED_VALUE_MUL_ZERO			? unusedValueMulZeroCaseStatements			(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, funcDefs, statements);
	}